

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O1

EC_GROUP * EC_KEY_parse_parameters(CBS *cbs)

{
  int iVar1;
  int iVar2;
  BIGNUM *pBVar3;
  EC_GROUP *pEVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  EC_GROUP *group;
  BIGNUM *bn;
  EC_POINT *p;
  char cVar7;
  EC_GROUP *pEVar8;
  long lVar9;
  CBS params;
  int has_cofactor;
  CBS curve_1;
  uint64_t version;
  CBS base;
  CBS field_id;
  CBS cofactor;
  CBS field_type;
  explicit_prime_curve curve;
  uint8_t local_129;
  BIGNUM *local_128;
  BIGNUM *local_120;
  BIGNUM *local_118;
  EC_GROUP *local_110;
  BIGNUM *local_108;
  CBS local_100;
  int local_ec;
  CBS local_e8;
  uint64_t local_d8;
  CBS local_d0;
  CBS local_c0;
  CBS local_b0;
  CBS local_a0;
  CBS local_90;
  CBS local_80;
  CBS local_70;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  
  iVar1 = CBS_peek_asn1_tag(cbs,0x20000010);
  if (iVar1 == 0) {
    pEVar4 = EC_KEY_parse_curve_name(cbs);
    return pEVar4;
  }
  iVar1 = CBS_get_asn1(cbs,&local_100,0x20000010);
  if (((((iVar1 != 0) && (iVar1 = CBS_get_asn1_uint64(&local_100,&local_d8), iVar1 != 0)) &&
       (local_d8 == 1)) &&
      ((((iVar1 = CBS_get_asn1(&local_100,&local_c0,0x20000010), iVar1 != 0 &&
         (iVar1 = CBS_get_asn1(&local_c0,&local_a0,6), iVar1 != 0)) &&
        ((local_a0.len == 7 &&
         ((*(int *)((long)local_a0.data + 3) == 0x1013dce && *(int *)local_a0.data == -0x31b779d6 &&
          (iVar1 = CBS_get_asn1(&local_c0,&local_90,2), iVar1 != 0)))))) &&
       (iVar1 = CBS_is_unsigned_asn1_integer(&local_90), iVar1 != 0)))) &&
     ((((local_c0.len == 0 && (iVar1 = CBS_get_asn1(&local_100,&local_e8,0x20000010), iVar1 != 0))
       && (iVar1 = CBS_get_asn1(&local_e8,&local_80,4), iVar1 != 0)) &&
      (((iVar1 = CBS_get_asn1(&local_e8,&local_70,4), iVar1 != 0 &&
        (iVar1 = CBS_get_optional_asn1(&local_e8,(CBS *)0x0,(int *)0x0,3), iVar1 != 0)) &&
       ((local_e8.len == 0 && (iVar1 = CBS_get_asn1(&local_100,&local_d0,4), iVar1 != 0)))))))) {
    iVar1 = CBS_get_asn1(&local_100,&local_40,2);
    if ((((iVar1 != 0) && (iVar1 = CBS_is_unsigned_asn1_integer(&local_40), iVar1 != 0)) &&
        (iVar1 = CBS_get_optional_asn1(&local_100,&local_b0,&local_ec,2), iVar1 != 0)) &&
       (local_100.len == 0)) {
      if ((local_ec == 0) || ((local_b0.len == 1 && (*local_b0.data == '\x01')))) {
        iVar1 = CBS_get_u8(&local_d0,&local_129);
        if ((iVar1 == 0) || (local_129 != '\x04')) {
          iVar1 = 0x6f;
          iVar2 = 0x104;
        }
        else {
          if ((local_d0.len & 1) == 0) {
            local_60.len = local_d0.len >> 1;
            local_60.data = local_d0.data;
            local_50.data = local_d0.data + local_60.len;
            local_50.len = local_60.len;
            pBVar3 = BN_new();
            pEVar4 = (EC_GROUP *)BN_new();
            pBVar5 = BN_new();
            pBVar6 = BN_new();
            local_128 = BN_new();
            local_120 = pBVar6;
            local_118 = pBVar5;
            local_110 = pEVar4;
            local_108 = pBVar3;
            if (local_128 == (BIGNUM *)0x0 ||
                ((pBVar6 == (BIGNUM *)0x0 || pBVar5 == (BIGNUM *)0x0) ||
                (pEVar4 == (EC_GROUP *)0x0 || pBVar3 == (BIGNUM *)0x0))) {
              pEVar8 = (EC_GROUP *)0x0;
            }
            else {
              lVar9 = 0;
              do {
                group = (EC_GROUP *)(**(code **)((long)kAllGroups + lVar9))();
                bn = EC_GROUP_get0_order(group);
                iVar1 = integers_equal(&local_40,bn);
                if (iVar1 == 0) {
                  cVar7 = '\x04';
                  pEVar8 = pEVar4;
                }
                else {
                  iVar2 = EC_GROUP_get_curve_GFp
                                    ((EC_GROUP *)group,local_108,(BIGNUM *)local_110,local_118,
                                     (BN_CTX *)0x0);
                  cVar7 = '\x01';
                  if (iVar2 == 0) {
                    pEVar8 = (EC_GROUP *)0x0;
                  }
                  else {
                    iVar2 = integers_equal(&local_90,(BIGNUM *)local_108);
                    if (((iVar2 == 0) ||
                        (iVar2 = integers_equal(&local_80,(BIGNUM *)local_110), iVar2 == 0)) ||
                       (iVar2 = integers_equal(&local_70,(BIGNUM *)local_118), iVar2 == 0)) {
LAB_004834a7:
                      cVar7 = '\x02';
                      pEVar8 = pEVar4;
                    }
                    else {
                      p = EC_GROUP_get0_generator((EC_GROUP *)group);
                      iVar2 = EC_POINT_get_affine_coordinates_GFp
                                        ((EC_GROUP *)group,p,local_120,local_128,(BN_CTX *)0x0);
                      pEVar8 = (EC_GROUP *)0x0;
                      if (iVar2 != 0) {
                        iVar2 = integers_equal(&local_60,(BIGNUM *)local_120);
                        if (iVar2 == 0) goto LAB_004834a7;
                        iVar2 = integers_equal(&local_50,(BIGNUM *)local_128);
                        if (iVar2 == 0) {
                          group = pEVar4;
                        }
                        cVar7 = (iVar2 == 0) + '\x01';
                        pEVar8 = group;
                      }
                    }
                  }
                }
                if (iVar1 != 0) goto LAB_004834cf;
                lVar9 = lVar9 + 8;
                pEVar4 = pEVar8;
              } while (lVar9 != 0x20);
              cVar7 = '\x02';
LAB_004834cf:
              if (cVar7 == '\x02') {
                pEVar8 = (EC_GROUP *)0x0;
                ERR_put_error(0xf,0,0x7b,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                              ,0x179);
              }
            }
            if (local_128 != (BIGNUM *)0x0) {
              BN_free(local_128);
            }
            if (local_120 != (BIGNUM *)0x0) {
              BN_free(local_120);
            }
            if (local_118 != (BIGNUM *)0x0) {
              BN_free(local_118);
            }
            if (local_110 != (EC_GROUP *)0x0) {
              BN_free((BIGNUM *)local_110);
            }
            if (local_108 == (BIGNUM *)0x0) {
              return pEVar8;
            }
            BN_free(local_108);
            return pEVar8;
          }
          iVar1 = 0x80;
          iVar2 = 0x109;
        }
      }
      else {
        iVar1 = 0x7b;
        iVar2 = 0xfc;
      }
      goto LAB_004830dc;
    }
  }
  iVar1 = 0x80;
  iVar2 = 0xf4;
LAB_004830dc:
  ERR_put_error(0xf,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ec/ec_asn1.cc"
                ,iVar2);
  return (EC_GROUP *)0x0;
}

Assistant:

EC_GROUP *EC_KEY_parse_parameters(CBS *cbs) {
  if (!CBS_peek_asn1_tag(cbs, CBS_ASN1_SEQUENCE)) {
    return EC_KEY_parse_curve_name(cbs);
  }

  // OpenSSL sometimes produces ECPrivateKeys with explicitly-encoded versions
  // of named curves.
  //
  // TODO(davidben): Remove support for this.
  struct explicit_prime_curve curve;
  if (!parse_explicit_prime_curve(cbs, &curve)) {
    return nullptr;
  }

  bssl::UniquePtr<BIGNUM> p(BN_new());
  bssl::UniquePtr<BIGNUM> a(BN_new());
  bssl::UniquePtr<BIGNUM> b(BN_new());
  bssl::UniquePtr<BIGNUM> x(BN_new());
  bssl::UniquePtr<BIGNUM> y(BN_new());
  if (p == nullptr || a == nullptr || b == nullptr || x == nullptr ||
      y == nullptr) {
    return nullptr;
  }

  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kAllGroups); i++) {
    const EC_GROUP *group = kAllGroups[i]();
    if (!integers_equal(&curve.order, EC_GROUP_get0_order(group))) {
      continue;
    }

    // The order alone uniquely identifies the group, but we check the other
    // parameters to avoid misinterpreting the group.
    if (!EC_GROUP_get_curve_GFp(group, p.get(), a.get(), b.get(), nullptr)) {
      return nullptr;
    }
    if (!integers_equal(&curve.prime, p.get()) ||
        !integers_equal(&curve.a, a.get()) ||
        !integers_equal(&curve.b, b.get())) {
      break;
    }
    if (!EC_POINT_get_affine_coordinates_GFp(
            group, EC_GROUP_get0_generator(group), x.get(), y.get(), nullptr)) {
      return nullptr;
    }
    if (!integers_equal(&curve.base_x, x.get()) ||
        !integers_equal(&curve.base_y, y.get())) {
      break;
    }
    return const_cast<EC_GROUP *>(group);
  }

  OPENSSL_PUT_ERROR(EC, EC_R_UNKNOWN_GROUP);
  return nullptr;
}